

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clause.cpp
# Opt level: O2

void * Kernel::Clause::operator_new(size_t sz,uint lits)

{
  void *pvVar1;
  
  pvVar1 = Lib::alloc((ulong)lits * 8 + 0x70);
  return pvVar1;
}

Assistant:

void* Clause::operator new(size_t sz, unsigned lits)
{
  ASS_EQ(sz,sizeof(Clause));

  RSTAT_CTR_INC("clauses created");

  //We have to get sizeof(Clause) + (_length-1)*sizeof(Literal*)
  //this way, because _length-1 wouldn't behave well for
  //_length==0 on x64 platform.
  size_t size = sizeof(Clause) + lits * sizeof(Literal*);
  size -= sizeof(Literal*);

  return ALLOC_KNOWN(size,"Clause");
}